

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_global_t::wasm_global_t(wasm_global_t *this,RefPtr<wabt::interp::Global> *ptr)

{
  RefPtr<wabt::interp::Extern> local_30;
  RefPtr<wabt::interp::Global> *local_18;
  RefPtr<wabt::interp::Global> *ptr_local;
  wasm_global_t *this_local;
  
  local_18 = ptr;
  ptr_local = (RefPtr<wabt::interp::Global> *)this;
  wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr<wabt::interp::Global>(&local_30,ptr);
  wasm_extern_t::wasm_extern_t(&this->super_wasm_extern_t,&local_30);
  wabt::interp::RefPtr<wabt::interp::Extern>::~RefPtr(&local_30);
  return;
}

Assistant:

wasm_global_t(RefPtr<Global> ptr) : wasm_extern_t(ptr) {}